

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_unpack(_Bool isbe,uchar *ptr,size_t *leftp,nvpair_t **nvpp)

{
  nvpair_t *nvp;
  uchar *puVar1;
  size_t sVar2;
  nvpair_t *pnVar3;
  
  nvp = (nvpair_t *)calloc(1,0x848);
  if (nvp != (nvpair_t *)0x0) {
    nvp->nvp_name = (char *)(nvp + 1);
    puVar1 = nvpair_unpack_header(isbe,nvp,ptr,leftp);
    if (puVar1 != (uchar *)0x0) {
      sVar2 = strlen(nvp->nvp_name);
      pnVar3 = (nvpair_t *)realloc(nvp,sVar2 + 0x49);
      if (pnVar3 != (nvpair_t *)0x0) {
        pnVar3->nvp_name = (char *)(pnVar3 + 1);
        pnVar3->nvp_data = 0;
        pnVar3->nvp_magic = 0x6e7670;
        *nvpp = pnVar3;
        return puVar1;
      }
    }
    free(nvp);
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack(bool isbe, const unsigned char *ptr, size_t *leftp,
    nvpair_t **nvpp)
{
	nvpair_t *nvp, *tmp;

	nvp = nv_calloc(1, sizeof(*nvp) + NV_NAME_MAX);
	if (nvp == NULL)
		return (NULL);
	nvp->nvp_name = (char *)(nvp + 1);

	ptr = nvpair_unpack_header(isbe, nvp, ptr, leftp);
	if (ptr == NULL)
		goto fail;
	tmp = nv_realloc(nvp, sizeof(*nvp) + strlen(nvp->nvp_name) + 1);
	if (tmp == NULL)
		goto fail;
	nvp = tmp;

	/* Update nvp_name after realloc(). */
	nvp->nvp_name = (char *)(nvp + 1);
	nvp->nvp_data = 0x00;
	nvp->nvp_magic = NVPAIR_MAGIC;
	*nvpp = nvp;
	return (ptr);
fail:
	nv_free(nvp);
	return (NULL);
}